

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_279991::LaneBasedExecutionQueue::~LaneBasedExecutionQueue
          (LaneBasedExecutionQueue *this)

{
  bool bVar1;
  reference this_00;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock_1;
  lock_guard<std::mutex> guard;
  undefined1 local_20 [4];
  uint i;
  unique_lock<std::mutex> lock;
  LaneBasedExecutionQueue *this_local;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__LaneBasedExecutionQueue_003e20f0;
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_20,&this->readyJobsMutex);
  this->shutdown = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  for (guard._M_device._4_4_ = 0; guard._M_device._4_4_ != this->numLanes;
      guard._M_device._4_4_ = guard._M_device._4_4_ + 1) {
    this_00 = std::
              vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
              ::operator[](&this->lanes,(ulong)guard._M_device._4_4_);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->(this_00);
    std::thread::join();
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&lock_1._M_owns,&this->killAfterTimeoutThreadMutex);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->killAfterTimeoutThread);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,&this->queueCompleteMutex);
    this->queueComplete = true;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              (&this->killAfterTimeoutThread);
    std::thread::join();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&lock_1._M_owns);
  std::condition_variable::~condition_variable(&this->queueCompleteCondition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->killAfterTimeoutThread);
  llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
  std::condition_variable::~condition_variable(&this->readyJobsCondition);
  FifoScheduler::~FifoScheduler(&this->readyPriorityJobs);
  std::
  unique_ptr<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
  ::~unique_ptr(&this->readyJobs);
  std::
  vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::~vector(&this->lanes);
  llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
  return;
}

Assistant:

virtual ~LaneBasedExecutionQueue() {
    // Shut down the lanes.
    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      shutdown = true;
      readyJobsCondition.notify_all();
    }

    for (unsigned i = 0; i != numLanes; ++i) {
      lanes[i]->join();
    }

    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      if (killAfterTimeoutThread) {
        {
          std::unique_lock<std::mutex> lock(queueCompleteMutex);
          queueComplete = true;
          queueCompleteCondition.notify_all();
        }
        killAfterTimeoutThread->join();
      }
    }
  }